

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O1

void lts2::PerformBIHTOnImage
               (Mat *anImage,Size *patchSize,Point *patchOffset,LBDOperator *LBD,Mat *result,
               int iterations,float sparsity,float patchMean)

{
  _InputArray *p_Var1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  Mat *pMVar5;
  int iVar6;
  float patchMean_00;
  Rect ROI;
  SignOperator A;
  Mat target;
  Mat inputPatch;
  Mat resultPatch;
  Mat freak;
  Mat patchOnes;
  Mat ocount;
  int local_460;
  int local_45c;
  int local_458;
  int local_454;
  Mat *local_450;
  Mat *local_448;
  LBDOperator *local_440;
  Size local_438;
  _OutputArray local_430;
  _InputArray local_418;
  SignOperator local_400;
  _InputArray local_3f0 [4];
  string local_390 [3];
  int local_330;
  int local_32c;
  ulong local_328;
  ulong local_320;
  long *local_318;
  undefined8 uStack_310;
  long local_308 [12];
  Mat local_2a8 [96];
  Mat local_248 [152];
  Mat local_1b0 [96];
  Mat local_150 [96];
  Mat local_f0 [96];
  _InputArray local_90 [4];
  
  local_440 = LBD;
  if ((*(uint *)anImage & 0xfff) == 5) {
    local_320 = **(ulong **)(anImage + 0x40) << 0x20 | **(ulong **)(anImage + 0x40) >> 0x20;
    cv::Mat::create(result,&local_320,5);
    local_90[0].obj = &local_318;
    local_308[0] = 0;
    local_308[1] = 0;
    local_318 = (long *)0x0;
    uStack_310 = 0;
    local_90[0].flags = -0x3efdfffa;
    local_90[0].sz = (Size)&DAT_400000001;
    cv::noArray();
    cv::Mat::setTo((_InputArray *)result,local_90);
    local_328 = **(ulong **)(anImage + 0x40) << 0x20 | **(ulong **)(anImage + 0x40) >> 0x20;
    local_308[0] = 0;
    local_308[1] = 0;
    local_318 = (long *)0x0;
    uStack_310 = 0;
    local_448 = anImage;
    cv::Mat::Mat((Mat *)local_90,&local_328,5,&local_318);
    local_330 = patchSize->width;
    local_32c = patchSize->height;
    cv::Mat::ones(&local_318,&local_330,5);
    cv::Mat::Mat(local_f0);
    (**(code **)(*local_318 + 0x18))(local_318,&local_318,local_f0,0xffffffff);
    local_450 = result;
    cv::Mat::~Mat(local_248);
    cv::Mat::~Mat(local_2a8);
    cv::Mat::~Mat((Mat *)local_308);
    SignOperator::SignOperator(&local_400);
    cv::Mat::Mat((Mat *)&local_318);
    cv::Mat::Mat(local_150);
    cv::Mat::Mat(local_1b0);
    iVar4 = patchOffset->x;
    if (iVar4 < 2) {
      iVar4 = 1;
    }
    iVar3 = 1;
    if (1 < patchOffset->y) {
      iVar3 = patchOffset->y;
    }
    patchOffset->x = iVar4;
    patchOffset->y = iVar3;
    if (0 < *(int *)(local_448 + 8)) {
      iVar4 = 0;
      pMVar5 = local_448;
      do {
        iVar3 = *(int *)(pMVar5 + 0xc);
        if (0 < iVar3) {
          iVar6 = 0;
          do {
            local_458 = patchSize->width;
            local_454 = patchSize->height;
            local_460 = iVar6;
            local_45c = iVar4;
            if ((local_454 + iVar4 <= *(int *)(pMVar5 + 8)) && (local_458 + iVar6 <= iVar3)) {
              cv::Mat::Mat((Mat *)local_390,pMVar5,(Rect_ *)&local_460);
              local_3f0[0].sz.width = 0;
              local_3f0[0].sz.height = 0;
              local_3f0[0].flags = 0x2010000;
              local_3f0[0].obj = &local_318;
              cv::Mat::copyTo((_OutputArray *)local_390);
              cv::Mat::~Mat((Mat *)local_390);
              patchMean_00 = patchMean;
              if (patchMean < 0.0) {
                local_3f0[0].sz.width = 0;
                local_3f0[0].sz.height = 0;
                local_3f0[0].flags = 0x1010000;
                local_3f0[0].obj = &local_318;
                cv::noArray();
                cv::mean((_InputArray *)local_390,local_3f0);
                patchMean_00 = (float)(double)local_390[0]._M_dataplus._M_p;
              }
              (*(local_440->super_LinearOperator)._vptr_LinearOperator[2])
                        (local_440,&local_318,local_150);
              SignOperator::Apply(&local_400,local_150,local_150);
              local_438.width = patchSize->width;
              local_438.height = patchSize->height;
              local_390[0]._M_dataplus._M_p = (pointer)&local_390[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"haar","");
              BinaryReconstructionWithBIHT
                        (local_1b0,local_440,local_150,iterations,sparsity,&local_438,patchMean_00,2
                         ,local_390);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_390[0]._M_dataplus._M_p != &local_390[0].field_2) {
                operator_delete(local_390[0]._M_dataplus._M_p,
                                local_390[0].field_2._M_allocated_capacity + 1);
              }
              cv::Mat::Mat((Mat *)local_390,local_450,(Rect_ *)&local_460);
              local_3f0[0].sz.width = 0;
              local_3f0[0].sz.height = 0;
              local_3f0[0].flags = 0x1010000;
              local_418.sz.width = 0;
              local_418.sz.height = 0;
              local_418.flags = 0x1010000;
              local_418.obj = local_1b0;
              local_430.super__InputArray.sz.width = 0;
              local_430.super__InputArray.sz.height = 0;
              local_430.super__InputArray.flags = -0x3dff0000;
              local_430.super__InputArray.obj = local_390;
              local_3f0[0].obj = local_390;
              p_Var1 = (_InputArray *)cv::noArray();
              cv::add(local_3f0,&local_418,&local_430,p_Var1,-1);
              cv::Mat::Mat((Mat *)local_3f0,(Mat *)local_90,(Rect_ *)&local_460);
              cv::Mat::operator=((Mat *)local_390,(Mat *)local_3f0);
              cv::Mat::~Mat((Mat *)local_3f0);
              local_3f0[0].sz.width = 0;
              local_3f0[0].sz.height = 0;
              local_3f0[0].flags = 0x1010000;
              local_418.sz.width = 0;
              local_418.sz.height = 0;
              local_418.flags = 0x1010000;
              local_418.obj = local_f0;
              local_430.super__InputArray.sz.width = 0;
              local_430.super__InputArray.sz.height = 0;
              local_430.super__InputArray.flags = -0x3dff0000;
              local_430.super__InputArray.obj = local_390;
              local_3f0[0].obj = local_390;
              p_Var1 = (_InputArray *)cv::noArray();
              cv::add(local_3f0,&local_418,&local_430,p_Var1,-1);
              cv::Mat::~Mat((Mat *)local_390);
              pMVar5 = local_448;
            }
            iVar6 = iVar6 + patchOffset->x;
            iVar3 = *(int *)(pMVar5 + 0xc);
          } while (iVar6 < iVar3);
        }
        iVar4 = iVar4 + patchOffset->y;
      } while (iVar4 < *(int *)(pMVar5 + 8));
    }
    finalize(local_450,(Mat *)local_90);
    cv::Mat::~Mat(local_1b0);
    cv::Mat::~Mat(local_150);
    cv::Mat::~Mat((Mat *)&local_318);
    SignOperator::~SignOperator(&local_400);
    cv::Mat::~Mat(local_f0);
    cv::Mat::~Mat((Mat *)local_90);
    return;
  }
  local_318 = local_308;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_318,"anImage.type() == CV_32F && anImage.channels() == 1","");
  uVar2 = cv::error(-0xd7,(string *)&local_318,"PerformBIHTOnImage",
                    "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/reconstruction.cpp"
                    ,0x29f);
  if (local_318 != local_308) {
    operator_delete(local_318,local_308[0] + 1);
  }
  _Unwind_Resume(uVar2);
}

Assistant:

void lts2::PerformBIHTOnImage(cv::Mat const &anImage, cv::Size patchSize, cv::Point patchOffset,
                             LBDOperator &LBD, cv::Mat &result, int iterations, float sparsity, float patchMean)
{
  CV_Assert(anImage.type() == CV_32F && anImage.channels() == 1);

  // Result image  
  result.create(anImage.size(), CV_32F);
  result.setTo(cv::Scalar(0));

  cv::Mat ocount(anImage.size(), CV_32FC1, cv::Scalar(0));
  cv::Mat patchOnes = cv::Mat::ones(patchSize, CV_32FC1);

  // Binarization operator
  SignOperator A;

  // Loop over the patches
  cv::Mat inputPatch, freak;
  cv::Mat resultPatch;
  patchOffset.x = MAX(1, patchOffset.x);
  patchOffset.y = MAX(1, patchOffset.y);

  for (int y = 0; y < anImage.rows; y += patchOffset.y)
    for (int x = 0; x < anImage.cols; x += patchOffset.x)
    {
      cv::Rect ROI(x, y, patchSize.width, patchSize.height);
      if ( y+patchSize.height > anImage.rows ||
           x+patchSize.width > anImage.cols )
        continue;

      anImage(ROI).copyTo(inputPatch);
      float pmean = patchMean;
      if (pmean < 0.0)
      {
        cv::Scalar mean = cv::mean(inputPatch);
        pmean = (float)mean[0];
      }

      LBD.Apply(inputPatch, freak);
      A.Apply(freak, freak);

      lts2::BinaryReconstructionWithBIHT(resultPatch, LBD, freak,
                                         iterations, sparsity, patchSize, pmean);

      cv::Mat target = result(ROI);
      target += resultPatch;

      target = ocount(ROI);
      target += patchOnes;
    }

  finalize(result, ocount);
}